

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O2

int __thiscall
fmt::v5::vfprintf<fmt::v5::basic_string_view<char>,char>
          (v5 *this,basic_ostream<char,_std::char_traits<char>_> *os,basic_string_view<char> *format
          ,basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
           args)

{
  int iVar1;
  basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  args_00;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_220;
  
  local_220.super_basic_buffer<char>.ptr_ = local_220.store_;
  local_220.super_basic_buffer<char>.size_ = 0;
  local_220.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_001d5f50;
  local_220.super_basic_buffer<char>.capacity_ = 500;
  args_00.field_1 =
       (anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>_2
        )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>_2
          )args.types_;
  args_00.types_ = (unsigned_long_long)format;
  internal::
  printf<char,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>>
            (&local_220.super_basic_buffer<char>,*(basic_string_view<char> *)os,args_00);
  internal::write<char>
            ((basic_ostream<char,_std::char_traits<char>_> *)this,
             &local_220.super_basic_buffer<char>);
  iVar1 = (int)local_220.super_basic_buffer<char>.size_;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(&local_220);
  return iVar1;
}

Assistant:

inline int vfprintf(std::basic_ostream<Char> &os,
                    const S &format,
                    basic_format_args<typename basic_printf_context_t<
                      internal::basic_buffer<Char>>::type> args) {
  basic_memory_buffer<Char> buffer;
  printf(buffer, to_string_view(format), args);
  internal::write(os, buffer);
  return static_cast<int>(buffer.size());
}